

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

Token * __thiscall embree::Stream<embree::Token>::unget(Stream<embree::Token> *this,size_t n)

{
  runtime_error *this_00;
  Token *pTVar1;
  ulong in_RSI;
  long in_RDI;
  Stream<embree::Token> *in_stack_00000088;
  
  if (*(ulong *)(in_RDI + 0x18) < in_RSI) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"cannot unget that many items");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) - in_RSI;
  *(ulong *)(in_RDI + 0x20) = in_RSI + *(long *)(in_RDI + 0x20);
  pTVar1 = peek(in_stack_00000088);
  return pTVar1;
}

Assistant:

const T& unget(size_t n = 1) {
      if (past < n) THROW_RUNTIME_ERROR ("cannot unget that many items");
      past -= n; future += n;
      return peek();
    }